

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APIntOps::RoundingUDiv(APIntOps *this,APInt *A,APInt *B,Rounding RM)

{
  bool bVar1;
  undefined8 extraout_RDX;
  APInt AVar3;
  APInt local_60;
  undefined4 local_4c;
  undefined1 local_48 [8];
  APInt Rem;
  APInt Quo;
  Rounding RM_local;
  APInt *B_local;
  APInt *A_local;
  undefined8 uVar2;
  
  if (RM < UP) {
    AVar3 = APInt::udiv((APInt *)this,A);
    uVar2 = AVar3._8_8_;
  }
  else {
    if (RM != UP) {
      llvm_unreachable_internal
                ("Unknown APInt::Rounding enum",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                 ,0xa76);
    }
    APInt::APInt((APInt *)&Rem.BitWidth);
    APInt::APInt((APInt *)local_48);
    APInt::udivrem(A,B,(APInt *)&Rem.BitWidth,(APInt *)local_48);
    bVar1 = APInt::operator==((APInt *)local_48,0);
    if (bVar1) {
      APInt::APInt((APInt *)this,(APInt *)&Rem.BitWidth);
    }
    else {
      APInt::APInt(&local_60,(APInt *)&Rem.BitWidth);
      llvm::operator+((llvm *)this,&local_60,1);
      APInt::~APInt(&local_60);
    }
    local_4c = 1;
    APInt::~APInt((APInt *)local_48);
    APInt::~APInt((APInt *)&Rem.BitWidth);
    uVar2 = extraout_RDX;
  }
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt llvm::APIntOps::RoundingUDiv(const APInt &A, const APInt &B,
                                   APInt::Rounding RM) {
  // Currently udivrem always rounds down.
  switch (RM) {
  case APInt::Rounding::DOWN:
  case APInt::Rounding::TOWARD_ZERO:
    return A.udiv(B);
  case APInt::Rounding::UP: {
    APInt Quo, Rem;
    APInt::udivrem(A, B, Quo, Rem);
    if (Rem == 0)
      return Quo;
    return Quo + 1;
  }
  }
  llvm_unreachable("Unknown APInt::Rounding enum");
}